

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsGearboxAngled.cpp
# Opt level: O2

void __thiscall chrono::ChShaftsGearboxAngled::ConstraintsLoadJacobians(ChShaftsGearboxAngled *this)

{
  ChConstraintThreeGeneric *this_00;
  Scalar SVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  Scalar *pSVar9;
  DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
  local_38 [32];
  
  SVar1 = this->t0;
  this_00 = &this->constraint;
  ChConstraintThreeGeneric::Get_Cq_a((ChRowVectorRef *)local_38,this_00);
  pSVar9 = Eigen::
           DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
           ::operator()(local_38,0);
  *pSVar9 = SVar1;
  ChConstraintThreeGeneric::Get_Cq_b((ChRowVectorRef *)local_38,this_00);
  pSVar9 = Eigen::
           DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
           ::operator()(local_38,0);
  *pSVar9 = (Scalar)&DAT_bff0000000000000;
  dVar2 = this->t0;
  dVar3 = (this->shaft_dir1).m_data[0];
  dVar4 = (this->shaft_dir1).m_data[1];
  dVar5 = (this->shaft_dir1).m_data[2];
  dVar6 = (this->shaft_dir2).m_data[0];
  dVar7 = (this->shaft_dir2).m_data[1];
  dVar8 = (this->shaft_dir2).m_data[2];
  ChConstraintThreeGeneric::Get_Cq_c((ChRowVectorRef *)local_38,this_00);
  pSVar9 = Eigen::
           DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
           ::operator()(local_38,0);
  *pSVar9 = 0.0;
  ChConstraintThreeGeneric::Get_Cq_c((ChRowVectorRef *)local_38,this_00);
  pSVar9 = Eigen::
           DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
           ::operator()(local_38,1);
  *pSVar9 = 0.0;
  ChConstraintThreeGeneric::Get_Cq_c((ChRowVectorRef *)local_38,this_00);
  pSVar9 = Eigen::
           DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
           ::operator()(local_38,2);
  *pSVar9 = 0.0;
  ChConstraintThreeGeneric::Get_Cq_c((ChRowVectorRef *)local_38,this_00);
  pSVar9 = Eigen::
           DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
           ::operator()(local_38,3);
  *pSVar9 = dVar2 * dVar3 - dVar6;
  ChConstraintThreeGeneric::Get_Cq_c((ChRowVectorRef *)local_38,this_00);
  pSVar9 = Eigen::
           DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
           ::operator()(local_38,4);
  *pSVar9 = dVar2 * dVar4 - dVar7;
  ChConstraintThreeGeneric::Get_Cq_c((ChRowVectorRef *)local_38,this_00);
  pSVar9 = Eigen::
           DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
           ::operator()(local_38,5);
  *pSVar9 = dVar2 * dVar5 - dVar8;
  return;
}

Assistant:

void ChShaftsGearboxAngled::ConstraintsLoadJacobians() {
    // compute jacobians
    constraint.Get_Cq_a()(0) = t0;
    constraint.Get_Cq_b()(0) = -1.0;

    // ChVector<> jacw = body->TransformDirectionParentToLocal(t0*shaft_dir1 - shaft_dir2);
    ChVector<> jacw = (t0 * shaft_dir1 - shaft_dir2);

    constraint.Get_Cq_c()(0) = 0;
    constraint.Get_Cq_c()(1) = 0;
    constraint.Get_Cq_c()(2) = 0;
    constraint.Get_Cq_c()(3) = jacw.x();
    constraint.Get_Cq_c()(4) = jacw.y();
    constraint.Get_Cq_c()(5) = jacw.z();
}